

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O1

int testMMapFileReaderTestsReadStruct(void)

{
  Span<unsigned_short,_3UL> data;
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  MMapFileReader reader;
  AutoDeleteTempFile tempfile;
  undefined4 uVar5;
  undefined2 uVar6;
  unkbyte10 in_stack_ffffffffffffff8e;
  AutoDeleteTempFile local_38;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_38);
  uVar6 = 0x1e;
  uVar5 = 0x14000a;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_38);
  data.m_ptr._4_2_ = uVar6;
  data.m_ptr._0_4_ = uVar5;
  data._6_10_ = in_stack_ffffffffffffff8e;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,3ul>(psVar2,data);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_38);
  MILBlob::Blob::MMapFileReader::MMapFileReader((MMapFileReader *)&stack0xffffffffffffff88,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength((MMapFileReader *)&stack0xffffffffffffff88);
  if (uVar3 == 6) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted((MMapFileReader *)&stack0xffffffffffffff88);
    if (!bVar1) {
      MILBlob::Blob::MMapFileReader::ReadData((MMapFileReader *)&stack0xffffffffffffff88,6,4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                 ,0x7b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x65);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,": expected exception, but none thrown.\n",0x27);
      goto LAB_001c91a2;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!(reader.IsEncrypted())",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"(reader.GetLength()) == (uint64_t(6))",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_001c91a2:
  MILBlob::Blob::MMapFileReader::~MMapFileReader((MMapFileReader *)&stack0xffffffffffffff88);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_38);
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadStruct()
{
    AutoDeleteTempFile tempfile;

    {
        std::array<uint16_t, 3> values{10, 20, 30};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(values));
    }

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(6));
    ML_ASSERT_NOT(reader.IsEncrypted());

    struct Int16Data {
        uint16_t a;
        uint16_t b;
    };

    struct Int64Data {
        uint64_t a;
        uint64_t b;
    };

    // test invalid offsets/lenths
    ML_ASSERT_THROWS(reader.ReadStruct<Int16Data>(6), std::range_error);
    ML_ASSERT_THROWS(reader.ReadStruct<Int64Data>(0), std::range_error);

    {
        const Int16Data& data = reader.ReadStruct<Int16Data>(2);
        ML_ASSERT_EQ(data.a, 20);
        ML_ASSERT_EQ(data.b, 30);
    }

    return 0;
}